

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O2

int Bbl_ManSaveSop(Bbl_Man_t *p,char *pSop,int nVars)

{
  int iVar1;
  size_t sVar2;
  char *pSop_00;
  int *piVar3;
  int iVar4;
  uint uVar5;
  
  sVar2 = strlen(pSop);
  uVar5 = (int)sVar2 + 1;
  pSop_00 = Bbl_ManSortSop(pSop,nVars);
  iVar1 = Bbl_ManSopCheckUnique(p,pSop_00,nVars,(int)uVar5 / (nVars + 3),p->pFncs->nSize);
  if (iVar1 == p->pFncs->nSize) {
    iVar4 = (uint)(0 < (int)(uVar5 & 0x80000003)) + (int)uVar5 / 4;
    piVar3 = (int *)Vec_StrFetch(p->pFncs,iVar4 * 4 + 4);
    piVar3[iVar4] = 0;
    *piVar3 = iVar4;
    strcpy((char *)(piVar3 + 1),pSop_00);
    if ((long)piVar3 - (long)p->pFncs->pArray != (long)iVar1) {
      __assert_fail("iFunc == (char *)pFnc - p->pFncs->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/bbl/bblif.c"
                    ,0x3cb,"int Bbl_ManSaveSop(Bbl_Man_t *, char *, int)");
    }
  }
  free(pSop_00);
  return iVar1;
}

Assistant:

int Bbl_ManSaveSop( Bbl_Man_t * p, char * pSop, int nVars )
{
    Bbl_Fnc_t * pFnc;
    char * pSopNew;
    int iFunc, Length = strlen(pSop) + 1;
    int nWords = Length / 4 + (Length % 4 > 0);
    // reorder cubes to semi-canicize SOPs
    pSopNew = Bbl_ManSortSop( pSop, nVars );
    // get the candidate location
    iFunc = Bbl_ManSopCheckUnique( p, pSopNew, nVars, Length / (nVars + 3), Vec_StrSize(p->pFncs) );
//    iFunc = Vec_StrSize(p->pFncs);
    if ( iFunc == Vec_StrSize(p->pFncs) )
    { // store this SOP
        pFnc = (Bbl_Fnc_t *)Vec_StrFetch( p->pFncs, sizeof(Bbl_Fnc_t) + nWords * sizeof(int) );
        pFnc->pWords[nWords-1] = 0;
        pFnc->nWords = nWords;
        strcpy( (char *)pFnc->pWords, pSopNew );
        assert( iFunc == (char *)pFnc - p->pFncs->pArray );
    }
    BBLIF_FREE( pSopNew );
    return iFunc;
}